

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O3

void failTwiceFunction_(void)

{
  MockSupport *pMVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  SimpleString SStack_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar1 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&SStack_28,"foobar");
  (*pMVar1->_vptr_MockSupport[3])(pMVar1,&SStack_28);
  SimpleString::~SimpleString(&SStack_28);
  SimpleString::~SimpleString(&local_18);
  pUVar2 = UtestShell::getCurrent();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0x1a])
            (pUVar2,"This failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0xa6,pTVar3);
  return;
}

Assistant:

static void failTwiceFunction_()
{
    mock().expectOneCall("foobar");
    FAIL("This failed");
}